

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adj_matrix_graph.c
# Opt level: O2

MatrixGraph createUDG(Vertices vertex,Edges edge,int countOfVertex,int countOfEdge)

{
  int **ppiVar1;
  MatrixGraph matrixGraph;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  if (countOfVertex < 1) {
    matrixGraph = (MatrixGraph)0x0;
  }
  else {
    matrixGraph = newEmptyMatrixGraph(countOfVertex,countOfEdge);
    matrixGraph->kind = UDG;
    putVertexIntoMatrix(matrixGraph,vertex,countOfVertex);
    uVar3 = (ulong)(uint)countOfEdge;
    if (countOfEdge < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 * 0xc - uVar2 != 0; uVar2 = uVar2 + 0xc) {
      ppiVar1 = matrixGraph->matrix;
      ppiVar1[*(int *)((long)&edge->vi + uVar2)][*(int *)((long)&edge->vj + uVar2)] = 1;
      ppiVar1[*(int *)((long)&edge->vj + uVar2)][*(int *)((long)&edge->vi + uVar2)] = 1;
    }
  }
  return matrixGraph;
}

Assistant:

MatrixGraph createUDG(Vertices vertex, Edges edge, int countOfVertex, int countOfEdge) {
    if (countOfVertex <= 0) return NULL;
    MatrixGraph matrixGraph = newEmptyMatrixGraph(countOfVertex, countOfEdge);
    matrixGraph->kind = UDG;
    putVertexIntoMatrix(matrixGraph, vertex, countOfVertex);

    // 构建矩阵
    for (int i = 0; i < countOfEdge; ++i) {
        matrixGraph->matrix[edge[i].vi][edge[i].vj] = 1;
        matrixGraph->matrix[edge[i].vj][edge[i].vi] = 1;
    }

    return matrixGraph;
}